

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O2

void __thiscall
ggml::cpu::aarch64::tensor_traits<block_q4_0,_4L,_4L,_(ggml_type)8>::forward_mul_mat
          (tensor_traits<block_q4_0,_4L,_4L,_(ggml_type)8> *this,ggml_compute_params *params,
          ggml_tensor *op)

{
  ggml_tensor *pgVar1;
  size_t bs;
  ggml_tensor *pgVar2;
  long lVar3;
  ulong uVar4;
  int64_t n_per_row;
  int64_t iVar5;
  size_t sVar6;
  ggml_from_float_t p_Var7;
  int iVar8;
  long lVar9;
  long lVar10;
  ggml_type_traits_cpu *pgVar11;
  long lVar12;
  char *pcVar13;
  int64_t nrow;
  int64_t extraout_RDX;
  size_t sVar14;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  int iVar15;
  long lVar16;
  ulong uVar17;
  undefined8 uVar18;
  int iVar19;
  ulong in_R9;
  void *pvVar20;
  void *vy;
  long lVar21;
  long lVar22;
  long local_b8;
  
  pgVar1 = op->src[0];
  bs = pgVar1->ne[1];
  if (op->ne[0] == bs) {
    pgVar2 = op->src[1];
    lVar3 = pgVar2->ne[1];
    if (op->ne[1] == lVar3) {
      if (op->ne[2] == pgVar2->ne[2]) {
        if (op->ne[3] == pgVar2->ne[3]) {
          if (op->nb[0] == 4) {
            uVar4 = op->nb[1];
            if (uVar4 < 4) {
              pcVar13 = "nb0 <= nb1";
              uVar18 = 0x17ca;
            }
            else if (op->nb[2] < uVar4) {
              pcVar13 = "nb1 <= nb2";
              uVar18 = 0x17cb;
            }
            else if (op->nb[3] < op->nb[2]) {
              pcVar13 = "nb2 <= nb3";
              uVar18 = 0x17cc;
            }
            else if (pgVar2->type == GGML_TYPE_F32) {
              n_per_row = pgVar2->ne[0];
              sVar14 = pgVar2->nb[1];
              iVar19 = params->ith;
              lVar21 = (long)iVar19;
              iVar5 = pgVar1->ne[0];
              sVar6 = pgVar1->nb[1];
              iVar15 = params->nth;
              lVar9 = (long)iVar15;
              iVar8 = ggml_n_dims();
              if (iVar8 == 2) {
                pvVar20 = params->wdata;
                lVar10 = ggml_row_size(8,n_per_row);
                pgVar11 = ggml_get_type_traits_cpu(GGML_TYPE_Q8_0);
                p_Var7 = pgVar11->from_float;
                lVar16 = (long)(iVar19 * 4);
                lVar22 = sVar14 * lVar16;
                vy = (void *)(lVar10 * lVar16 + (long)pvVar20);
                nrow = lVar3 % 4;
                uVar17 = lVar3 - nrow;
                lVar12 = (long)(iVar15 * 4);
                for (; lVar16 < (long)uVar17; lVar16 = lVar16 + lVar12) {
                  ggml_quantize_mat_t<4l,(ggml_type)8>
                            ((float *)((long)pgVar2->data + lVar22),vy,nrow,n_per_row);
                  lVar22 = lVar22 + sVar14 * lVar12;
                  vy = (void *)((long)vy + lVar10 * lVar12);
                  nrow = extraout_RDX;
                }
                lVar12 = uVar17 + lVar21;
                lVar16 = sVar14 * lVar12;
                pvVar20 = (void *)((long)pvVar20 + lVar10 * lVar12);
                for (; lVar12 < lVar3; lVar12 = lVar12 + lVar9) {
                  (*p_Var7)((float *)((long)pgVar2->data + lVar16),pvVar20,n_per_row);
                  pvVar20 = (void *)((long)pvVar20 + lVar10 * lVar9);
                  lVar16 = lVar16 + sVar14 * lVar9;
                }
                ggml_barrier(params->threadpool);
                pvVar20 = params->wdata;
                lVar10 = ggml_row_size(8,n_per_row);
                lVar12 = (long)(bs * lVar21) / lVar9;
                lVar9 = (long)((lVar21 + 1) * bs) / lVar9;
                lVar21 = (lVar12 - lVar12 % 4) + 4;
                if (lVar12 % 4 == 0) {
                  lVar21 = lVar12;
                }
                sVar14 = lVar9 % 4;
                lVar12 = (lVar9 - sVar14) + 4;
                if (sVar14 == 0) {
                  lVar12 = lVar9;
                }
                if (lVar21 < lVar12) {
                  iVar19 = (int)iVar5;
                  if (lVar3 < 4) {
                    iVar15 = (int)lVar12 - (int)lVar21;
                  }
                  else {
                    iVar15 = (int)lVar12 - (int)lVar21;
                    in_R9 = uVar17 & 0xffffffff;
                    gemm<block_q4_0,4l,4l,(ggml_type)8>
                              (iVar19,(float *)(lVar21 * 4 + (long)op->data),bs,
                               (void *)((long)pgVar1->data + sVar6 * lVar21),pvVar20,(int)uVar17,
                               iVar15);
                    sVar14 = extraout_RDX_00;
                  }
                  local_b8 = sVar6 * lVar21;
                  lVar12 = (long)(int)uVar17;
                  pvVar20 = (void *)((long)pvVar20 + lVar10 * lVar12);
                  lVar9 = uVar4 * lVar12 + lVar21 * 4;
                  for (; lVar12 < lVar3; lVar12 = lVar12 + 1) {
                    gemv<block_q4_0,4l,4l,(ggml_type)8>
                              (iVar19,(float *)((long)op->data + lVar9),sVar14,
                               (void *)((long)pgVar1->data + local_b8),pvVar20,(int)in_R9,iVar15);
                    lVar9 = lVar9 + uVar4;
                    pvVar20 = (void *)((long)pvVar20 + lVar10);
                    sVar14 = extraout_RDX_01;
                  }
                }
                return;
              }
              pcVar13 = "ggml_n_dims(op->src[0]) == 2";
              uVar18 = 0x17d0;
            }
            else {
              pcVar13 = "src1->type == GGML_TYPE_F32";
              uVar18 = 0x17ce;
            }
          }
          else {
            pcVar13 = "nb0 == sizeof(float)";
            uVar18 = 0x17c9;
          }
        }
        else {
          pcVar13 = "ne3 == ne13";
          uVar18 = 0x17c6;
        }
      }
      else {
        pcVar13 = "ne2 == ne12";
        uVar18 = 0x17c5;
      }
    }
    else {
      pcVar13 = "ne1 == ne11";
      uVar18 = 0x17c4;
    }
  }
  else {
    pcVar13 = "ne0 == ne01";
    uVar18 = 0x17c3;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
             ,uVar18,"GGML_ASSERT(%s) failed",pcVar13);
}

Assistant:

void forward_mul_mat(ggml_compute_params * params, ggml_tensor * op) {
        const ggml_tensor * src0 = op->src[0];
        const ggml_tensor * src1 = op->src[1];
        ggml_tensor *       dst  = op;

        GGML_TENSOR_BINARY_OP_LOCALS

        const int ith = params->ith;
        const int nth = params->nth;

        GGML_ASSERT(ne0 == ne01);
        GGML_ASSERT(ne1 == ne11);
        GGML_ASSERT(ne2 == ne12);
        GGML_ASSERT(ne3 == ne13);

        // dst cannot be transposed or permuted
        GGML_ASSERT(nb0 == sizeof(float));
        GGML_ASSERT(nb0 <= nb1);
        GGML_ASSERT(nb1 <= nb2);
        GGML_ASSERT(nb2 <= nb3);

        GGML_ASSERT(src1->type == GGML_TYPE_F32);

        GGML_ASSERT(ggml_n_dims(op->src[0]) == 2);
        // GGML_ASSERT(ggml_n_dims(op->src[1]) == 2);

        char *       wdata = static_cast<char *>(params->wdata);
        const size_t nbw1  = ggml_row_size(PARAM_TYPE, ne10);

        assert(params->wsize >= nbw1 * ne11);

        const ggml_from_float_t from_float = ggml_get_type_traits_cpu(PARAM_TYPE)->from_float;

        int64_t i11_processed = 0;
        for (int64_t i11 = ith * 4; i11 < ne11 - ne11 % 4; i11 += nth * 4) {
            ggml_quantize_mat_t<INTER_SIZE, PARAM_TYPE>((float *) ((char *) src1->data + i11 * nb11), (void *) (wdata + i11 * nbw1), 4, ne10);
        }

        i11_processed = ne11 - ne11 % 4;
        for (int64_t i11 = i11_processed + ith; i11 < ne11; i11 += nth) {
            from_float((float *) ((char *) src1->data + i11 * nb11), (void *) (wdata + i11 * nbw1), ne10);
        }

        ggml_barrier(params->threadpool);

        const void * src1_wdata      = params->wdata;
        const size_t src1_col_stride = ggml_row_size(PARAM_TYPE, ne10);
        int64_t      src0_start      = (ith * ne01) / nth;
        int64_t      src0_end        = ((ith + 1) * ne01) / nth;
        src0_start = (src0_start % NB_COLS) ? src0_start + NB_COLS - (src0_start % NB_COLS) : src0_start;
        src0_end   = (src0_end   % NB_COLS) ? src0_end   + NB_COLS - (src0_end   % NB_COLS) : src0_end;
        if (src0_start >= src0_end) {
            return;
        }

        // If there are more than three rows in src1, use gemm; otherwise, use gemv.
        if (ne11 > 3) {
            gemm<BLOC_TYPE, INTER_SIZE, NB_COLS, PARAM_TYPE>(ne00,
                    (float *) ((char *) dst->data) + src0_start, ne01,
                    (const char *) src0->data + src0_start * nb01,
                    (const char *) src1_wdata, ne11 - ne11 % 4, src0_end - src0_start);
        }
        for (int iter = ne11 - ne11 % 4; iter < ne11; iter++) {
            gemv<BLOC_TYPE, INTER_SIZE, NB_COLS, PARAM_TYPE>(ne00,
                    (float *) ((char *) dst->data + (iter * nb1)) + src0_start, ne01,
                    (const char *) src0->data + src0_start * nb01,
                    (const char *) src1_wdata + (src1_col_stride * iter), 1,
                    src0_end - src0_start);
        }
    }